

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::ParseFlexBufferValue(Parser *this,Builder *builder)

{
  int iVar1;
  pointer pVVar2;
  pointer pVVar3;
  bool bVar4;
  char cVar5;
  int64_t i;
  Builder *in_RDX;
  CheckedError *ce;
  long lVar6;
  int t;
  Parser *this_00;
  size_t start;
  CheckedError ce_1;
  allocator<char> local_71;
  double d;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long local_50;
  pointer *local_48;
  ParseDepthGuard depth_guard;
  
  ParseDepthGuard::ParseDepthGuard(&depth_guard,(Parser *)builder);
  ParseDepthGuard::Check((ParseDepthGuard *)this);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b4b;
  CheckedError::~CheckedError((CheckedError *)this);
  iVar1 = *(int *)((long)&(builder->stack_).
                          super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
  if ((iVar1 == 0x2b) || (iVar1 == 0x2d)) {
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b4b;
    CheckedError::~CheckedError((CheckedError *)this);
    if (*(int *)((long)&(builder->stack_).
                        super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start + 4) != 0x104) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&d,"floating-point constant expected",(allocator<char> *)&ce_1);
      Error(this,(string *)builder);
      std::__cxx11::string::~string((string *)&d);
      goto LAB_00114b4b;
    }
    std::__cxx11::string::insert
              ((ulong)&(builder->stack_).
                       super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0,'\x01');
    ParseFlexBufferNumericConstant(this,builder);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b4b;
    CheckedError::~CheckedError((CheckedError *)this);
    Next(this);
LAB_00114a88:
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    this_00 = this;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b4b;
    goto LAB_00114a98;
  }
  t = (int)builder;
  if (iVar1 != 0x5b) {
    if (iVar1 == 0x103) {
      StringToFloatImpl<double>
                (&d,(char *)(builder->stack_).
                            super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      flexbuffers::Builder::Double(in_RDX,d);
      Expect(this,t);
    }
    else if (iVar1 == 0x101) {
      flexbuffers::Builder::String
                (in_RDX,(string *)
                        &(builder->stack_).
                         super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Expect(this,t);
    }
    else if (iVar1 == 0x102) {
      i = StringToInt((char *)(builder->stack_).
                              super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,10);
      flexbuffers::Builder::Int(in_RDX,i);
      Expect(this,t);
    }
    else {
      if (iVar1 == 0x7b) {
        local_50 = (long)(in_RDX->stack_).
                         super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(in_RDX->stack_).
                         super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        Expect((Parser *)&ce_1,t);
        ce_1.has_been_checked_ = true;
        if (ce_1.is_error_ == false) {
          CheckedError::~CheckedError(&ce_1);
          local_48 = &(builder->stack_).
                      super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          lVar6 = 0;
          do {
            if (((byte)(lVar6 == 0 |
                       *(byte *)((long)&builder[6].stack_.
                                        super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) ^ 1)
                 == 1) &&
               (*(int *)((long)&(builder->stack_).
                                super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4) == 0x7d)) {
LAB_00114ab0:
              Next((Parser *)&ce_1);
              ce_1.has_been_checked_ = true;
              if (ce_1.is_error_ == false) {
                CheckedError::~CheckedError(&ce_1);
                ce_1.is_error_ = false;
                ce_1.has_been_checked_ = false;
              }
              break;
            }
            d = (double)&local_60;
            local_68 = 0;
            local_60._M_local_buf[0] = '\0';
            std::__cxx11::string::_M_assign((string *)&d);
            if (*(int *)((long)&(builder->stack_).
                                super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4) == 0x101) {
              Next((Parser *)&ce_1);
            }
            else {
              Expect((Parser *)&ce_1,t);
            }
            ce_1.has_been_checked_ = true;
            if (ce_1.is_error_ != false) goto LAB_00114994;
            CheckedError::~CheckedError(&ce_1);
            if (((char)builder[8].key_pool._M_t._M_impl.super__Rb_tree_header._M_header._M_color !=
                 _S_black) ||
               ((*(uint *)((long)&(builder->stack_).
                                  super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 4) | 0x20) != 0x7b)) {
              Expect((Parser *)&ce_1,t);
              ce_1.has_been_checked_ = true;
              if (ce_1.is_error_ != false) goto LAB_00114994;
              CheckedError::~CheckedError(&ce_1);
            }
            flexbuffers::Builder::Key(in_RDX,(string *)&d);
            ParseFlexBufferValue((Parser *)&ce_1,builder);
            ce_1.has_been_checked_ = true;
            if (ce_1.is_error_ == false) {
              CheckedError::~CheckedError(&ce_1);
              lVar6 = lVar6 + 1;
              ce_1.is_error_ = false;
              ce_1.has_been_checked_ = true;
            }
            else if (ce_1.is_error_ != false) goto LAB_00114994;
            CheckedError::~CheckedError(&ce_1);
            if (*(int *)((long)&(builder->stack_).
                                super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4) == 0x7d) {
              std::__cxx11::string::~string((string *)&d);
              goto LAB_00114ab0;
            }
            ParseComma((Parser *)&ce_1);
            ce_1.has_been_checked_ = true;
            if (ce_1.is_error_ != false) goto LAB_00114994;
            CheckedError::~CheckedError(&ce_1);
            std::__cxx11::string::~string((string *)&d);
          } while( true );
        }
        goto LAB_00114adb;
      }
      bVar4 = IsIdent((Parser *)builder,"true");
      if (bVar4) {
        flexbuffers::Builder::Bool(in_RDX,true);
        Next(this);
      }
      else {
        bVar4 = IsIdent((Parser *)builder,"false");
        if (bVar4) {
          flexbuffers::Builder::Bool(in_RDX,false);
          Next(this);
        }
        else {
          bVar4 = IsIdent((Parser *)builder,"null");
          if (bVar4) {
            flexbuffers::Builder::Null(in_RDX);
            Next(this);
          }
          else {
            bVar4 = IsIdent((Parser *)builder,"inf");
            if (((!bVar4) && (bVar4 = IsIdent((Parser *)builder,"infinity"), !bVar4)) &&
               (bVar4 = IsIdent((Parser *)builder,"nan"), !bVar4)) {
              TokenError(this);
              goto LAB_00114b4b;
            }
            ParseFlexBufferNumericConstant(this,builder);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00114b4b;
            CheckedError::~CheckedError((CheckedError *)this);
            Next(this);
          }
        }
      }
    }
    goto LAB_00114a88;
  }
  pVVar2 = (in_RDX->stack_).
           super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pVVar3 = (in_RDX->stack_).
           super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  Expect(this,t);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  cVar5 = *(char *)&(this->super_ParserState).prev_cursor_;
  if (cVar5 == '\0') {
    CheckedError::~CheckedError((CheckedError *)this);
    lVar6 = 0;
    while ((bVar4 = lVar6 != 0, lVar6 = lVar6 + -1,
           bVar4 && (~*(byte *)((long)&builder[6].stack_.
                                       super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) & 1)
                    == 0 ||
           (*(int *)((long)&(builder->stack_).
                            super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                            ._M_impl.super__Vector_impl_data._M_start + 4) != 0x5d))) {
      ParseFlexBufferValue(this,builder);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      cVar5 = *(char *)&(this->super_ParserState).prev_cursor_;
      if (cVar5 != '\0') goto LAB_001149b8;
      CheckedError::~CheckedError((CheckedError *)this);
      if (*(int *)((long)&(builder->stack_).
                          super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4) == 0x5d) break;
      ParseComma(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      cVar5 = *(char *)&(this->super_ParserState).prev_cursor_;
      if (cVar5 != '\0') goto LAB_001149b8;
      CheckedError::~CheckedError((CheckedError *)this);
    }
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    cVar5 = *(char *)&(this->super_ParserState).prev_cursor_;
    if (cVar5 == '\0') {
      CheckedError::~CheckedError((CheckedError *)this);
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
      goto LAB_001149fd;
    }
  }
LAB_001149b8:
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (cVar5 != '\0') goto LAB_00114b4b;
LAB_001149fd:
  CheckedError::~CheckedError((CheckedError *)this);
  flexbuffers::Builder::EndVector(in_RDX,(long)pVVar2 - (long)pVVar3 >> 4,false,false);
LAB_00114a9d:
  *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  goto LAB_00114b4b;
LAB_00114994:
  std::__cxx11::string::~string((string *)&d);
LAB_00114adb:
  *(bool *)&(this->super_ParserState).prev_cursor_ = ce_1.is_error_;
  ce_1.has_been_checked_ = true;
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (ce_1.is_error_ == false) {
    start = local_50 >> 4;
    CheckedError::~CheckedError((CheckedError *)this);
    flexbuffers::Builder::EndMap(in_RDX,start);
    if (in_RDX->has_duplicate_keys_ != true) {
      this_00 = (Parser *)&ce_1;
LAB_00114a98:
      CheckedError::~CheckedError((CheckedError *)this_00);
      goto LAB_00114a9d;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&d,"FlexBuffers map has duplicate keys",&local_71);
    Error(this,(string *)builder);
    std::__cxx11::string::~string((string *)&d);
  }
  CheckedError::~CheckedError(&ce_1);
LAB_00114b4b:
  (depth_guard.parser_)->parse_depth_counter_ = (depth_guard.parser_)->parse_depth_counter_ + -1;
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseFlexBufferValue(flexbuffers::Builder *builder) {
  ParseDepthGuard depth_guard(this);
  ECHECK(depth_guard.Check());

  switch (token_) {
    case '{': {
      auto start = builder->StartMap();
      size_t fieldn_outer = 0;
      auto err =
          ParseTableDelimiters(fieldn_outer, nullptr,
                               [&](const std::string &name, size_t &fieldn,
                                   const StructDef *) -> CheckedError {
                                 builder->Key(name);
                                 ECHECK(ParseFlexBufferValue(builder));
                                 fieldn++;
                                 return NoError();
                               });
      ECHECK(err);
      builder->EndMap(start);
      if (builder->HasDuplicateKeys())
        return Error("FlexBuffers map has duplicate keys");
      break;
    }
    case '[': {
      auto start = builder->StartVector();
      size_t count = 0;
      ECHECK(ParseVectorDelimiters(count, [&](size_t &) -> CheckedError {
        return ParseFlexBufferValue(builder);
      }));
      builder->EndVector(start, false, false);
      break;
    }
    case kTokenStringConstant:
      builder->String(attribute_);
      EXPECT(kTokenStringConstant);
      break;
    case kTokenIntegerConstant:
      builder->Int(StringToInt(attribute_.c_str()));
      EXPECT(kTokenIntegerConstant);
      break;
    case kTokenFloatConstant: {
      double d;
      StringToNumber(attribute_.c_str(), &d);
      builder->Double(d);
      EXPECT(kTokenFloatConstant);
      break;
    }
    case '-':
    case '+': {
      // `[-+]?(nan|inf|infinity)`, see ParseSingleValue().
      const auto sign = static_cast<char>(token_);
      NEXT();
      if (token_ != kTokenIdentifier)
        return Error("floating-point constant expected");
      attribute_.insert(size_t(0), size_t(1), sign);
      ECHECK(ParseFlexBufferNumericConstant(builder));
      NEXT();
      break;
    }
    default:
      if (IsIdent("true")) {
        builder->Bool(true);
        NEXT();
      } else if (IsIdent("false")) {
        builder->Bool(false);
        NEXT();
      } else if (IsIdent("null")) {
        builder->Null();
        NEXT();
      } else if (IsIdent("inf") || IsIdent("infinity") || IsIdent("nan")) {
        ECHECK(ParseFlexBufferNumericConstant(builder));
        NEXT();
      } else
        return TokenError();
  }
  return NoError();
}